

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_transaction.cpp
# Opt level: O2

ClientContext * __thiscall duckdb::CatalogTransaction::GetContext(CatalogTransaction *this)

{
  ClientContext *pCVar1;
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  if ((this->context).ptr != (ClientContext *)0x0) {
    pCVar1 = optional_ptr<duckdb::ClientContext,_true>::operator*(&this->context);
    return pCVar1;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,
             "Attempting to get a context in a CatalogTransaction without a context",&local_39);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

CatalogTransaction CatalogTransaction::GetSystemTransaction(DatabaseInstance &db) {
	return CatalogTransaction(db, 1, 1);
}